

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  Status stat;
  int iVar1;
  pointer pnVar2;
  ostream *poVar3;
  long lVar4;
  type_conflict5 tVar5;
  int iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  SPxOut *pSVar7;
  long lVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  char *t;
  uint *puVar12;
  int i;
  long lVar13;
  byte bVar14;
  long local_1d0;
  Verbosity old_verbosity_1;
  DIdxSet *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar14 = 0;
  leavetol(&pricingTol,this);
  this->m_pricingViolCoUpToDate = true;
  this_00 = &this->m_pricingViolCo;
  lVar9 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&this_00->m_backend,0);
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  local_1c0 = &this->infeasibilitiesCo;
  local_1d0 = (long)(this->thevectors->set).thenum;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            (&result.m_backend,&(this->sparsePricingFactor).m_backend,&local_1d0);
  iVar6 = boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&result.m_backend);
  lVar4 = 0x1c;
  for (lVar13 = 0; lVar13 < (this->thevectors->set).thenum; lVar13 = lVar13 + 1) {
    stat = ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.stat)->data[lVar13];
    if (this->theRep * stat < 1) {
      test((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&result.m_backend,this,(int)lVar13,stat);
      pnVar2 = (this->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar10 = &result.m_backend;
      puVar12 = (uint *)((long)(pnVar2->m_backend).data._M_elems + lVar9);
      for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar12 = (pcVar10->data)._M_elems[0];
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      }
      *(int *)((long)(&(pnVar2->m_backend).data + 1) + lVar9) = result.m_backend.exp;
      *(bool *)((long)(&(pnVar2->m_backend).data + 1) + lVar9 + 4U) = result.m_backend.neg;
      *(undefined8 *)((long)(&(pnVar2->m_backend).data + 1) + lVar9 + 8U) = result.m_backend._120_8_
      ;
      a = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)((long)(((this->theTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar9);
      if (this->remainingRoundsEnterCo == 0) {
        pnVar11 = &pricingTol;
        pcVar10 = &result.m_backend;
        for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar10->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar5 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
        if (tVar5) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(((this->theTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar9));
          DIdxSet::addIdx(local_1c0,(int)lVar13);
          (this->isInfeasibleCo).data[lVar13] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        else {
          (this->isInfeasibleCo).data[lVar13] = 0;
        }
        if (iVar6 < (this->infeasibilitiesCo).super_IdxSet.num) {
          pSVar7 = this->spxout;
          if ((pSVar7 != (SPxOut *)0x0) && (3 < (int)pSVar7->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar7->m_verbosity;
            local_1d0 = CONCAT44(local_1d0._4_4_,4);
            (*pSVar7->_vptr_SPxOut[2])(pSVar7,&local_1d0);
            pSVar7 = soplex::operator<<(this->spxout," --- using dense pricing");
            std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result.m_backend);
          }
          this->remainingRoundsEnterCo = 5;
          this->sparsePricingEnterCo = false;
          (this->infeasibilitiesCo).super_IdxSet.num = 0;
        }
      }
      else {
        pnVar11 = &pricingTol;
        pcVar10 = &result.m_backend;
        for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar10->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar5 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
        if (tVar5) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(((this->theTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar9));
          this->m_numViol = this->m_numViol + 1;
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 ((long)(((this->theTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar9),0.0);
      if (this->remainingRoundsEnterCo == 0) {
        (this->isInfeasibleCo).data[lVar13] = 0;
      }
    }
    lVar9 = lVar9 + 0x80;
  }
  iVar1 = (this->infeasibilitiesCo).super_IdxSet.num;
  if ((iVar1 == 0) && (this->sparsePricingEnterCo == false)) {
    this->remainingRoundsEnterCo = this->remainingRoundsEnterCo + -1;
  }
  else if ((iVar1 <= iVar6) && (this->sparsePricingEnterCo == false)) {
    pSVar7 = this->spxout;
    if ((pSVar7 != (SPxOut *)0x0) &&
       (old_verbosity_1 = pSVar7->m_verbosity, 3 < (int)old_verbosity_1)) {
      result.m_backend.data._M_elems[0] = 4;
      (*pSVar7->_vptr_SPxOut[2])();
      pSVar7 = this->spxout;
      iVar6 = *(int *)(pSVar7->m_streams[pSVar7->m_verbosity] +
                      *(long *)(*(long *)pSVar7->m_streams[pSVar7->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingEnter != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar7,t);
      pSVar7 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar3 = pSVar7->m_streams[pSVar7->m_verbosity];
      lVar4 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar4 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result.m_backend,(long)(this->infeasibilitiesCo).super_IdxSet.num,(type *)0x0);
      local_1d0 = (long)(this->thevectors->set).thenum;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&local_b8,&result.m_backend,&local_1d0);
      pSVar7 = soplex::operator<<(pSVar7,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_b8);
      poVar3 = pSVar7->m_streams[pSVar7->m_verbosity];
      lVar4 = *(long *)poVar3;
      lVar9 = *(long *)(lVar4 + -0x18);
      *(uint *)(poVar3 + lVar9 + 0x18) = *(uint *)(poVar3 + lVar9 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar3 + *(long *)(lVar4 + -0x18) + 8) = (long)iVar6;
      std::endl<char,std::char_traits<char>>(poVar3);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity_1);
    }
    this->sparsePricingEnterCo = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}